

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::MemoryImport::~MemoryImport(MemoryImport *this)

{
  MemoryImport *this_local;
  
  (this->super_ImportMixin<(wabt::ExternalKind)2>).super_Import._vptr_Import =
       (_func_int **)&PTR__MemoryImport_0029ec58;
  Memory::~Memory(&this->memory);
  ImportMixin<(wabt::ExternalKind)2>::~ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)2>);
  return;
}

Assistant:

explicit MemoryImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Memory>(), memory(name) {}